

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaxEpsRefine.h
# Opt level: O1

dfa_t * __thiscall
covenant::MaxEpsRefine<covenant::Sym>::refine
          (dfa_t *__return_storage_ptr__,MaxEpsRefine<covenant::Sym> *this,cond_eps_gen_t *gen)

{
  element_type *peVar1;
  State __fd;
  sp_counted_base *__addr_len;
  sockaddr *__addr;
  dfa_t *dfa;
  shared_count local_18;
  
  if ((gen->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      (gen->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    peVar1 = (gen->_tfac).px;
    __addr_len = (gen->_tfac).pn.pi_;
    if (__addr_len != (sp_counted_base *)0x0) {
      LOCK();
      __addr_len->use_count_ = __addr_len->use_count_ + 1;
      UNLOCK();
    }
    (__return_storage_ptr__->_tfac).px = peVar1;
    (__return_storage_ptr__->_tfac).pn.pi_ = __addr_len;
    if (__addr_len != (sp_counted_base *)0x0) {
      LOCK();
      __addr_len->use_count_ = __addr_len->use_count_ + 1;
      UNLOCK();
    }
    __return_storage_ptr__->start = 0;
    (__return_storage_ptr__->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (__return_storage_ptr__->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    (__return_storage_ptr__->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    (__return_storage_ptr__->trans).
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->trans).
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->trans).
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->eps).
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->eps).
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->eps).
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->eps).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
    local_18.pi_ = __addr_len;
    boost::detail::shared_count::~shared_count(&local_18);
    __fd = DFA<covenant::Sym>::state(__return_storage_ptr__,0);
    __return_storage_ptr__->start = __fd.id;
    DFA<covenant::Sym>::accept(__return_storage_ptr__,__fd.id,__addr,(socklen_t *)__addr_len);
  }
  else {
    maximum_refinement(__return_storage_ptr__,this,gen,0,0);
  }
  return __return_storage_ptr__;
}

Assistant:

dfa_t refine(cond_eps_gen_t& gen) 
    {
      if(gen.word.size() == 0)
      {
        // Just give an empty automaton.
        dfa_t dfa (gen.getTermFactory ());
        State q0 = dfa.state(0);
        dfa.setStart(q0);
        dfa.accept(q0);
        return dfa;
      }
      return maximum_refinement(gen, 0, 0);
    }